

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate.c
# Opt level: O3

void * dsAlloc(uint64_t length)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  dsSuperObject *pdVar5;
  bool bVar6;
  dsCrate *crate;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  ulong *puVar13;
  
  pthread_once(&keyOnce,makeKey);
  crate = (dsCrate *)pthread_getspecific(key);
  if (crate == (dsCrate *)0x0) {
    pcVar10 = "%s(): Can\'t get active crate.\n";
LAB_00102b27:
    dsRunLogCallback(pcVar10,"dsAlloc");
    return (void *)0x0;
  }
  debugDump(crate);
  uVar2 = length + 0x18;
  if (uVar2 < 0x400) {
    uVar9 = 0;
    dsRunLogCallback("%s(): Group: %d\n","getGroup",0);
  }
  else {
    uVar9 = uVar2;
    uVar12 = 0xffffffff;
    do {
      uVar11 = uVar12;
      uVar12 = uVar11 + 1;
      bVar6 = 0xfffff < uVar9;
      uVar9 = uVar9 >> 10;
    } while (bVar6);
    uVar9 = (ulong)(uVar11 + 2);
    dsRunLogCallback("%s(): Group: %d\n","getGroup",uVar9);
    if (6 < uVar12) {
LAB_00102b20:
      pcVar10 = "%s(): Can\'t allocate object.\n";
      goto LAB_00102b27;
    }
  }
LAB_00102ac2:
  uVar3 = crate->super->headGroupOffset[uVar9];
  if (uVar3 == 0xffffffffffffffff) goto code_r0x00102acd;
  uVar7 = (crate->map).offset;
  if ((uVar7 <= uVar3) && (uVar3 + 0x10 <= uVar7 + (crate->map).length)) {
    pvVar4 = (crate->map).ptr;
    if (pvVar4 == (void *)0x0) goto LAB_00102b03;
    puVar13 = (ulong *)((long)pvVar4 + uVar3);
    if (-1 < (long)*puVar13) {
      pcVar10 = "%s(): Object should be free but isn\'t.\n";
      goto LAB_00102b83;
    }
    uVar8 = *puVar13 & 0x3fffffffffffffff;
    uVar7 = uVar8 - uVar2;
    if (uVar8 < uVar2) {
      pcVar10 = "%s(): Object groups are corrupt!\n";
      goto LAB_00102b83;
    }
    crate->super->headGroupOffset[uVar9] = puVar13[1];
    puVar13[1] = 0xffffffffffffffff;
    uVar9 = (crate->map).offset;
    if ((uVar3 < uVar9) || (uVar9 + (crate->map).length < uVar3 + uVar8)) {
      dsRunLogCallback("%s(): Can\'t map region outside of crate.\n","mapObject");
      goto LAB_00102b19;
    }
    if (length + 0x31 <= uVar8) {
      puVar1 = (ulong *)((long)puVar13 + uVar2);
      *(ulong *)(uVar2 + (long)puVar13) = uVar7 | 0x8000000000000000;
      *(undefined8 *)(length + 0x20 + (long)puVar13) = 0xffffffffffffffff;
      *(ulong *)(((uVar7 & 0x3fffffffffffffff) - 8) + (long)puVar1) = uVar3 + uVar2;
      if ((*puVar13 & 0x4000000000000000) != 0) {
        *puVar1 = *puVar1 | 0x4000000000000000;
      }
      if (uVar7 < 0x400) {
        uVar9 = 0;
        dsRunLogCallback("%s(): Group: %d\n","getGroup",0);
      }
      else {
        uVar12 = 0xffffffff;
        do {
          uVar11 = uVar12;
          uVar12 = uVar11 + 1;
          bVar6 = 0xfffff < uVar7;
          uVar7 = uVar7 >> 10;
        } while (bVar6);
        uVar9 = (ulong)(uVar11 + 2);
        dsRunLogCallback("%s(): Group: %d\n","getGroup",uVar9);
        if (6 < uVar12) {
          dsRunLogCallback("%s(): Group does not exist.\n","linkToGroup");
          pcVar10 = "%s(): Can\'t link free object.\n";
LAB_00102b83:
          dsRunLogCallback(pcVar10,"allocateObject");
          goto LAB_00102b20;
        }
      }
      pdVar5 = crate->super;
      puVar1[1] = pdVar5->headGroupOffset[uVar9];
      pdVar5->headGroupOffset[uVar9] = uVar3 + uVar2;
      uVar8 = uVar2;
    }
    *puVar13 = uVar8;
    puVar13[1] = 0xffffffffffffffff;
    *(ulong *)((long)puVar13 + ((uVar8 & 0x3fffffffffffffff) - 8)) = uVar3;
    debugDump(crate);
    return puVar13 + 2;
  }
  dsRunLogCallback("%s(): Can\'t map region outside of crate.\n","mapObject");
LAB_00102b03:
  uVar8 = 0x10;
LAB_00102b19:
  dsRunLogCallback("%s(): Can\'t mapObject(,%lu,%lu)\n","allocateObject",uVar3,uVar8);
  goto LAB_00102b20;
code_r0x00102acd:
  uVar9 = uVar9 + 1;
  if (uVar9 == 8) goto LAB_00102b20;
  goto LAB_00102ac2;
}

Assistant:

void *
dsAlloc(uint64_t length)
{
	dsCrate *crate;
	void *memory;

	if ((crate = getActiveCrate()) == NULL) {
		dsLog("Can't get active crate.\n");
		return NULL;
	}

	if ((memory = allocateObject(crate, length)) == NULL) {
		dsLog("Can't allocate object.\n");
		return NULL;
	}

	memory += sizeof(dsObject);

	return memory;
}